

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord3h>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord3h *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined4 local_3f;
  uint16_t local_3b;
  optional<tinyusdz::value::texcoord3h> local_38;
  undefined4 local_2f;
  uint16_t local_2b;
  double local_28;
  
  if (v == (texcoord3h *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_value<tinyusdz::value::texcoord3h>(&local_38,this);
    if (local_38.has_value_ == true) {
      local_2b = local_38.contained._4_2_;
      local_2f = local_38.contained._0_4_;
      local_3f = local_38.contained._0_4_;
      local_3b = local_38.contained._4_2_;
    }
    if (local_38.has_value_ != false) goto LAB_001ea152;
    t = local_28;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord3h,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<tinyusdz::value::texcoord3h>(&local_38,this);
    if (local_38.has_value_ == true) {
      local_3f = local_38.contained._0_4_;
      local_3b = local_38.contained._4_2_;
    }
    if (local_38.has_value_ != false) {
LAB_001ea152:
      (v->r).value = local_3b;
      v->s = (half)(undefined2)local_3f;
      v->t = (half)local_3f._2_2_;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }